

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

QString * __thiscall QDateTimeEdit::sectionText(QDateTimeEdit *this,Section section)

{
  QDateTimeEditPrivate *str;
  int in_EDX;
  QDateTimeEditPrivate *in_RDI;
  long in_FS_OFFSET;
  int sectionIndex;
  QDateTimeEditPrivate *d;
  QFlagsStorage<QDateTimeEdit::Section> in_stack_ffffffffffffff8c;
  QVariant *val;
  QDateTimeEditPrivate *this_00;
  bool local_4d;
  undefined1 local_28 [24];
  Int local_10;
  QFlagsStorageHelper<QDateTimeEdit::Section,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  str = d_func((QDateTimeEdit *)0x55a66b);
  local_4d = true;
  if (in_EDX != 0) {
    local_10 = (str->sections).super_QFlagsStorageHelper<QDateTimeEdit::Section,_4>.
               super_QFlagsStorage<QDateTimeEdit::Section>.i;
    local_c.super_QFlagsStorage<QDateTimeEdit::Section>.i =
         (QFlagsStorage<QDateTimeEdit::Section>)
         ::operator&(NoSection,(QFlags<QDateTimeEdit::Section>)in_stack_ffffffffffffff8c.i);
    local_4d = QFlags<QDateTimeEdit::Section>::operator!((QFlags<QDateTimeEdit::Section> *)&local_c)
    ;
  }
  if (local_4d == false) {
    val = &(str->super_QAbstractSpinBoxPrivate).value;
    (**(code **)(*(long *)&(str->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate + 0x110))
              (local_28);
    QDateTimeEditPrivate::updateCache(in_RDI,val,(QString *)str);
    QString::~QString((QString *)0x55a70c);
    QDateTimeEditPrivate::absoluteIndex(this_00,(Section)((ulong)in_RDI >> 0x20),(int)in_RDI);
    QDateTimeParser::sectionText((int)in_RDI);
  }
  else {
    QString::QString((QString *)0x55a6bf);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QString QDateTimeEdit::sectionText(Section section) const
{
    Q_D(const QDateTimeEdit);
    if (section == QDateTimeEdit::NoSection || !(section & d->sections)) {
        return QString();
    }

    d->updateCache(d->value, d->displayText());
    const int sectionIndex = d->absoluteIndex(section, 0);
    return d->sectionText(sectionIndex);
}